

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metamakefile.cpp
# Opt level: O3

void __thiscall
BuildsMetaMakefileGenerator::~BuildsMetaMakefileGenerator(BuildsMetaMakefileGenerator *this)

{
  ~BuildsMetaMakefileGenerator(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

~BuildsMetaMakefileGenerator() { clearBuilds(); }